

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartFpuControl.cpp
# Opt level: O1

void __thiscall SmartFPUControlT<true>::~SmartFPUControlT(SmartFPUControlT<true> *this)

{
  if (this->m_oldFpuControl != 0xffffffff) {
    this->m_oldFpuControl = 0xffffffff;
    this->m_err = 0;
  }
  return;
}

Assistant:

SmartFPUControlT<enabled>::~SmartFPUControlT()
{
    if (enabled)
    {
        RestoreFPUControl();
    }
#if DBG
    else
    {
        uint currentFpuControl;
        m_err = GetFPUControl(&currentFpuControl);
        if (m_err == 0 && m_oldFpuControlForConsistencyCheck != INVALID_FPUCONTROL)
        {
            Assert(m_oldFpuControlForConsistencyCheck == currentFpuControl);
        }
    }
#endif
}